

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::link::insert<libtorrent::aux::torrent>
          (link *this,vector<libtorrent::aux::torrent_*> *list,torrent *self)

{
  torrent *local_18;
  
  if (this->index < 0) {
    local_18 = self;
    ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
    push_back(&list->
               super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
              ,&local_18);
    this->index = (int)((ulong)((long)(list->
                                      super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                      ).
                                      super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(list->
                                     super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                     ).
                                     super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  return;
}

Assistant:

void insert(aux::vector<T*>& list, T* self)
		{
			if (index >= 0) return;
			TORRENT_ASSERT(index == -1);
			list.push_back(self);
			index = int(list.size()) - 1;
		}